

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMMapping.c
# Opt level: O1

_Bool ARM_blx_to_arm_mode(cs_struct *h,uint id)

{
  return id == 0xa90;
}

Assistant:

bool ARM_blx_to_arm_mode(cs_struct *h, unsigned int id) {
	int i;

	for (i = 0; insn_blx_rel_to_arm[i]; i++)
		if (id == insn_blx_rel_to_arm[i])
			return true;

	// not found
	return false;

}